

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_kills(textblock *tb,monster_race *race,monster_lore_conflict *lore,
                      bitflag *known_flags)

{
  _Bool _Var1;
  monster_sex_t sex;
  char *pcVar2;
  bool bVar3;
  bool local_2d;
  _Bool dead;
  _Bool out;
  monster_sex_t msex;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  local_2d = true;
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    sex = lore_monster_sex(race);
    _Var1 = flag_has_dbg(known_flags,0xc,1,"known_flags","RF_UNIQUE");
    if (_Var1) {
      bVar3 = race->max_num != '\0';
      if (lore->deaths == 0) {
        if (!bVar3) {
          textblock_append(tb,"You have slain this foe.  ");
        }
        local_2d = !bVar3;
      }
      else {
        pcVar2 = lore_pronoun_nominative(sex,true);
        textblock_append(tb,"%s has slain %d of your ancestors",pcVar2,(ulong)lore->deaths);
        if (bVar3) {
          pcVar2 = "remain";
          if (lore->deaths == 1) {
            pcVar2 = "remains";
          }
          textblock_append(tb,", who %s unavenged.  ",pcVar2);
        }
        else {
          textblock_append(tb,", but you have taken revenge!  ");
        }
      }
    }
    else if (lore->deaths == 0) {
      if (lore->pkills == 0) {
        if (lore->tkills == 0) {
          textblock_append(tb,"No battles to the death are recalled.  ");
        }
        else {
          textblock_append(tb,"Your ancestors have killed at least %d of these creatures.  ",
                           (ulong)lore->tkills);
        }
      }
      else {
        textblock_append(tb,"You have killed at least %d of these creatures.  ",(ulong)lore->pkills)
        ;
      }
    }
    else {
      pcVar2 = "have";
      if (lore->deaths == 1) {
        pcVar2 = "has";
      }
      textblock_append(tb,"%d of your ancestors %s been killed by this creature, ",
                       (ulong)lore->deaths,pcVar2);
      if (lore->pkills == 0) {
        if (lore->tkills == 0) {
          pcVar2 = lore_pronoun_nominative(sex,false);
          textblock_append_c(tb,'\x04',"and %s is not ever known to have been defeated.  ",pcVar2);
        }
        else {
          textblock_append(tb,"and your ancestors have exterminated at least %d of the creatures.  "
                           ,(ulong)lore->tkills);
        }
      }
      else {
        textblock_append(tb,"and you have exterminated at least %d of the creatures.  ",
                         (ulong)lore->pkills);
      }
    }
    if (local_2d) {
      textblock_append(tb,"\n");
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x36e,
                "void lore_append_kills(textblock *, const struct monster_race *, const struct monster_lore *, const bitflag *)"
               );
}

Assistant:

void lore_append_kills(textblock *tb, const struct monster_race *race,
					   const struct monster_lore *lore,
					   const bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	bool out = true;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Treat by whether unique, then by whether they have any player kills */
	if (rf_has(known_flags, RF_UNIQUE)) {
		/* Hack -- Determine if the unique is "dead" */
		bool dead = (race->max_num == 0) ? true : false;

		/* We've been killed... */
		if (lore->deaths) {
			/* Killed ancestors */
			textblock_append(tb, "%s has slain %d of your ancestors",
							 lore_pronoun_nominative(msex, true), lore->deaths);

			/* But we've also killed it */
			if (dead)
				textblock_append(tb, ", but you have taken revenge!  ");

			/* Unavenged (ever) */
			else
				textblock_append(tb, ", who %s unavenged.  ",
								 VERB_AGREEMENT(lore->deaths, "remains",
												"remain"));
		} else if (dead) { /* Dead unique who never hurt us */
			textblock_append(tb, "You have slain this foe.  ");
		} else {
			/* Alive and never killed us */
			out = false;
		}
	} else if (lore->deaths) {
		/* Dead ancestors */
		textblock_append(tb, "%d of your ancestors %s been killed by this creature, ", lore->deaths, VERB_AGREEMENT(lore->deaths, "has", "have"));

		if (lore->pkills) {
			/* Some kills this life */
			textblock_append(tb, "and you have exterminated at least %d of the creatures.  ", lore->pkills);
		} else if (lore->tkills) {
			/* Some kills past lives */
			textblock_append(tb, "and your ancestors have exterminated at least %d of the creatures.  ", lore->tkills);
		} else {
			/* No kills */
			textblock_append_c(tb, COLOUR_RED, "and %s is not ever known to have been defeated.  ", lore_pronoun_nominative(msex, false));
		}
	} else {
		if (lore->pkills) {
			/* Killed some this life */
			textblock_append(tb, "You have killed at least %d of these creatures.  ", lore->pkills);
		} else if (lore->tkills) {
			/* Killed some last life */
			textblock_append(tb, "Your ancestors have killed at least %d of these creatures.  ", lore->tkills);
		} else {
			/* Killed none */
			textblock_append(tb, "No battles to the death are recalled.  ");
		}
	}

	/* Separate */
	if (out)
		textblock_append(tb, "\n");
}